

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlanningUnitMADPDiscreteParameters.cpp
# Opt level: O0

void __thiscall
PlanningUnitMADPDiscreteParameters::SanityCheck(PlanningUnitMADPDiscreteParameters *this)

{
  bool bVar1;
  undefined8 uVar2;
  PlanningUnitMADPDiscreteParameters *in_RDI;
  char *in_stack_00000008;
  E *in_stack_00000010;
  
  bVar1 = GetComputeJointBeliefs(in_RDI);
  if ((bVar1) && (bVar1 = GetComputeJointActionObservationHistories(in_RDI), !bVar1)) {
    Print(this);
    uVar2 = __cxa_allocate_exception(0x28);
    E::E(in_stack_00000010,in_stack_00000008);
    __cxa_throw(uVar2,&E::typeinfo,E::~E);
  }
  return;
}

Assistant:

void PlanningUnitMADPDiscreteParameters::SanityCheck() const
{
    if(GetComputeJointBeliefs() && !GetComputeJointActionObservationHistories())
    {
        Print();
        throw(E("PlanningUnitMADPDiscreteParameters::SanityCheck error, in order to compute joint beliefs all joint action observation histories also need to be generated"));
    }
}